

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListenerImpl.cpp
# Opt level: O0

shared_ptr<SL::WS_LITE::IWSListener_Configuration> __thiscall
SL::WS_LITE::WSListener_Configuration::onConnection
          (WSListener_Configuration *this,
          function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_SL::WS_LITE::HttpHeader_&)>
          *handle)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_SL::WS_LITE::HttpHeader_&)>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<SL::WS_LITE::IWSListener_Configuration> sVar5;
  shared_ptr<SL::WS_LITE::HubContext> local_50;
  __shared_ptr_access<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_40;
  shared_ptr<SL::WS_LITE::ThreadContext> *t;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
  *__range2;
  function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_SL::WS_LITE::HttpHeader_&)>
  *handle_local;
  WSListener_Configuration *this_local;
  
  peVar2 = std::
           __shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)((handle->super__Function_base)._M_functor._M_pod_data + 8));
  __end2 = std::
           vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
           ::begin(&peVar2->ThreadContexts);
  t = (shared_ptr<SL::WS_LITE::ThreadContext> *)
      std::
      vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
      ::end(&peVar2->ThreadContexts);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<SL::WS_LITE::ThreadContext>_*,_std::vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>_>
                                *)&t);
    if (!bVar1) {
      std::
      make_shared<SL::WS_LITE::WSListener_Configuration,std::shared_ptr<SL::WS_LITE::HubContext>&>
                (&local_50);
      std::shared_ptr<SL::WS_LITE::IWSListener_Configuration>::
      shared_ptr<SL::WS_LITE::WSListener_Configuration,void>
                ((shared_ptr<SL::WS_LITE::IWSListener_Configuration> *)this,
                 (shared_ptr<SL::WS_LITE::WSListener_Configuration> *)&local_50);
      std::shared_ptr<SL::WS_LITE::WSListener_Configuration>::~shared_ptr
                ((shared_ptr<SL::WS_LITE::WSListener_Configuration> *)&local_50);
      sVar5.super___shared_ptr<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = extraout_RDX._M_pi;
      sVar5.super___shared_ptr<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = &this->super_IWSListener_Configuration;
      return (shared_ptr<SL::WS_LITE::IWSListener_Configuration>)
             sVar5.
             super___shared_ptr<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2>;
    }
    local_40 = (__shared_ptr_access<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)__gnu_cxx::
                  __normal_iterator<std::shared_ptr<SL::WS_LITE::ThreadContext>_*,_std::vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>_>
                  ::operator*(&__end2);
    peVar3 = std::
             __shared_ptr_access<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_40);
    peVar4 = std::
             __shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar3->WebSocketContext_);
    bVar1 = std::function::operator_cast_to_bool((function *)&peVar4->onConnection);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    peVar3 = std::
             __shared_ptr_access<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_40);
    peVar4 = std::
             __shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar3->WebSocketContext_);
    std::
    function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_SL::WS_LITE::HttpHeader_&)>
    ::operator=(&peVar4->onConnection,in_RDX);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<SL::WS_LITE::ThreadContext>_*,_std::vector<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>_>
    ::operator++(&__end2);
  }
  __assert_fail("!t->WebSocketContext_->onConnection",
                "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ListenerImpl.cpp"
                ,0x9d,
                "virtual std::shared_ptr<IWSListener_Configuration> SL::WS_LITE::WSListener_Configuration::onConnection(const std::function<void (const std::shared_ptr<IWebSocket> &, const HttpHeader &)> &)"
               );
}

Assistant:

std::shared_ptr<IWSListener_Configuration>
    WSListener_Configuration::onConnection(const std::function<void(const std::shared_ptr<IWebSocket> &, const HttpHeader &)> &handle)
    {
        for (auto &t : Impl_->ThreadContexts) {
            assert(!t->WebSocketContext_->onConnection);
            t->WebSocketContext_->onConnection = handle;
        }
        return std::make_shared<WSListener_Configuration>(Impl_);
    }